

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OperatorExpressions.cpp
# Opt level: O1

void slang::ast::BinaryExpression::analyzeOpTypes
               (Type *clt,Type *crt,Type *originalLt,Type *originalRt,Expression *lhs,
               Expression *rhs,ASTContext *context,SourceRange opRange,DiagCode code,
               bool isComparison,
               optional<std::basic_string_view<char,_std::char_traits<char>_>_> extraDiagArg)

{
  byte bVar1;
  __index_type _Var2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  logic_t lVar6;
  EffectiveSign left;
  EffectiveSign right;
  bitwidth_t bVar7;
  uint uVar8;
  uint uVar9;
  Symbol *pSVar10;
  Symbol *pSVar11;
  Type *pTVar12;
  Diagnostic *pDVar13;
  Diagnostic *pDVar14;
  variant_alternative_t<1UL,_variant<monostate,_SVInt,_real_t,_shortreal_t,_NullPlaceholder,_vector<ConstantValue,_allocator<ConstantValue>_>,_basic_string<char,_char_traits<char>,_allocator<char>_>,_CopyPtr<AssociativeArray>,_CopyPtr<SVQueue>,_CopyPtr<SVUnion>,_UnboundedPlaceholder>_>
  *pvVar15;
  optional<unsigned_int> oVar16;
  ConstantValue lcv;
  ConstantValue rcv;
  EvalContext evalCtx;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 local_418;
  uint uStack_410;
  undefined1 uStack_40c;
  byte bStack_40b;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 local_408;
  uint uStack_400;
  undefined1 uStack_3fc;
  byte bStack_3fb;
  DiagCode local_3f4;
  Type *local_3f0;
  Type *local_3e8;
  _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  local_3e0;
  _Optional_payload_base<unsigned_int> local_3b8;
  _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  local_3b0;
  EvalContext local_388;
  
  local_3f4 = code;
  local_3f0 = originalLt;
  local_3e8 = originalRt;
  pSVar10 = Expression::getSymbolReference(lhs,true);
  pSVar11 = Expression::getSymbolReference(rhs,true);
  if (pSVar10 != (Symbol *)0x0) {
    if (pSVar10->kind == Parameter) {
      bVar1 = pSVar10[5].field_0x34;
    }
    else {
      if (pSVar10->kind != Variable) goto LAB_0039161a;
      bVar1 = *(byte *)((long)&pSVar10[5].name._M_str + 4) & 2;
    }
    if (bVar1 != 0) {
      return;
    }
  }
LAB_0039161a:
  if (pSVar11 != (Symbol *)0x0) {
    if (pSVar11->kind == Parameter) {
      bVar1 = pSVar11[5].field_0x34;
    }
    else {
      if (pSVar11->kind != Variable) goto LAB_0039164b;
      bVar1 = *(byte *)((long)&pSVar11[5].name._M_str + 4) & 2;
    }
    if (bVar1 != 0) {
      return;
    }
  }
LAB_0039164b:
  if (isComparison) {
    if ((pSVar10 != (Symbol *)0x0) && (pSVar10->kind == EnumValue)) {
      pTVar12 = DeclaredType::getType((DeclaredType *)(pSVar10 + 1));
      if (pTVar12->canonical == (Type *)0x0) {
        Type::resolveCanonical(pTVar12);
      }
      if (((pTVar12->canonical->super_Symbol).kind == EnumType) &&
         (bVar3 = Type::isMatching(pTVar12->canonical[1].canonical,crt), bVar3)) {
        return;
      }
    }
    if ((pSVar11 != (Symbol *)0x0) && (pSVar11->kind == EnumValue)) {
      pTVar12 = DeclaredType::getType((DeclaredType *)(pSVar11 + 1));
      if (pTVar12->canonical == (Type *)0x0) {
        Type::resolveCanonical(pTVar12);
      }
      if (((pTVar12->canonical->super_Symbol).kind == EnumType) &&
         (bVar3 = Type::isMatching(pTVar12->canonical[1].canonical,clt), bVar3)) {
        return;
      }
    }
  }
  bVar3 = Type::isSimpleBitVector(clt);
  if ((bVar3) && (bVar3 = Type::isSimpleBitVector(crt), bVar3)) {
    bVar3 = Type::isSigned(clt);
    bVar4 = Type::isSigned(crt);
    bVar5 = true;
    if (bVar3 != bVar4) {
      left = Expression::getEffectiveSign(lhs,false);
      right = Expression::getEffectiveSign(rhs,false);
      bVar5 = Expression::signMatches(left,right);
    }
    if (isComparison) {
      if (bVar5 != false) {
        return;
      }
      bVar7 = Type::getBitWidth(clt);
      if (bVar7 == 8) {
        if (clt->canonical == (Type *)0x0) {
          Type::resolveCanonical(clt);
        }
        if (((clt->canonical->super_Symbol).kind == PredefinedIntegerType) &&
           (bVar3 = Expression::isImplicitString(rhs), bVar3)) {
          return;
        }
      }
      bVar7 = Type::getBitWidth(crt);
      if (bVar7 == 8) {
        if (crt->canonical == (Type *)0x0) {
          Type::resolveCanonical(crt);
        }
        if (((crt->canonical->super_Symbol).kind == PredefinedIntegerType) &&
           (bVar3 = Expression::isImplicitString(lhs), bVar3)) {
          return;
        }
      }
      pDVar13 = ASTContext::addDiag(context,(DiagCode)0xd30007,opRange);
      pDVar14 = ast::operator<<(pDVar13,local_3f0);
      ast::operator<<(pDVar14,local_3e8);
      pDVar13 = Diagnostic::operator<<(pDVar13,lhs->sourceRange);
      Diagnostic::operator<<(pDVar13,rhs->sourceRange);
      return;
    }
    if (bVar5 != false) {
      uVar8 = Type::getBitWidth(clt);
      uVar9 = Type::getBitWidth(crt);
      if (uVar8 == uVar9) {
        return;
      }
      oVar16 = Expression::getEffectiveWidth(lhs);
      local_3b8 = (_Optional_payload_base<unsigned_int>)Expression::getEffectiveWidth(rhs);
      if (((ulong)local_3b8 >> 0x20 & 1) == 0 ||
          ((ulong)oVar16.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                  super__Optional_payload_base<unsigned_int> >> 0x20 & 1) == 0) {
        return;
      }
      if (oVar16.super__Optional_base<unsigned_int,_true,_true>._M_payload.
          super__Optional_payload_base<unsigned_int>._M_payload <= uVar9 &&
          local_3b8._M_payload._M_value <= uVar8) {
        return;
      }
      local_388.astCtx.assertionInstance = context->assertionInstance;
      local_388.stack.super_SmallVectorBase<slang::ast::EvalContext::Frame>.data_ =
           (pointer)local_388.stack.super_SmallVectorBase<slang::ast::EvalContext::Frame>.
                    firstElement;
      local_388.astCtx.scope.ptr = (context->scope).ptr;
      local_388.astCtx.lookupIndex = context->lookupIndex;
      local_388.astCtx._12_4_ = *(undefined4 *)&context->field_0xc;
      local_388.astCtx.flags.m_bits = (context->flags).m_bits;
      local_388.astCtx.instanceOrProc = context->instanceOrProc;
      local_388.astCtx.firstTempVar = context->firstTempVar;
      local_388.astCtx.randomizeDetails = context->randomizeDetails;
      local_388.flags.m_bits = '\0';
      local_388._60_8_ = 0;
      local_388._68_8_ = 0;
      local_388.queueTarget._4_4_ = 0;
      local_388.stack.super_SmallVectorBase<slang::ast::EvalContext::Frame>.len = 0;
      local_388.stack.super_SmallVectorBase<slang::ast::EvalContext::Frame>.cap = 2;
      local_388.lvalStack.super_SmallVectorBase<slang::ast::LValue_*>.data_ =
           (pointer)local_388.lvalStack.super_SmallVectorBase<slang::ast::LValue_*>.firstElement;
      local_388.lvalStack.super_SmallVectorBase<slang::ast::LValue_*>.len = 0;
      local_388.lvalStack.super_SmallVectorBase<slang::ast::LValue_*>.cap = 5;
      local_388.diags.super_SmallVector<slang::Diagnostic,_2UL>.
      super_SmallVectorBase<slang::Diagnostic>.data_ =
           (pointer)local_388.diags.super_SmallVector<slang::Diagnostic,_2UL>.
                    super_SmallVectorBase<slang::Diagnostic>.firstElement;
      local_388.diags.super_SmallVector<slang::Diagnostic,_2UL>.
      super_SmallVectorBase<slang::Diagnostic>.len = 0;
      local_388.diags.super_SmallVector<slang::Diagnostic,_2UL>.
      super_SmallVectorBase<slang::Diagnostic>.cap = 2;
      local_388.warnings.super_SmallVector<slang::Diagnostic,_2UL>.
      super_SmallVectorBase<slang::Diagnostic>.data_ =
           (pointer)local_388.warnings.super_SmallVector<slang::Diagnostic,_2UL>.
                    super_SmallVectorBase<slang::Diagnostic>.firstElement;
      local_388.warnings.super_SmallVector<slang::Diagnostic,_2UL>.
      super_SmallVectorBase<slang::Diagnostic>.len = 0;
      local_388.warnings.super_SmallVector<slang::Diagnostic,_2UL>.
      super_SmallVectorBase<slang::Diagnostic>.cap = 2;
      local_388.backtraceReported = false;
      local_388.disableRange.startLoc = (SourceLocation)0x0;
      local_388.disableRange.endLoc = (SourceLocation)0x0;
      Expression::eval((ConstantValue *)&local_3e0,lhs,&local_388);
      _Var2 = local_3e0._M_index;
      std::__detail::__variant::
      _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
      ::~_Variant_storage(&local_3e0);
      Expression::eval((ConstantValue *)&local_3e0,rhs,&local_388);
      if (_Var2 != '\0') {
        uVar8 = 0xffffff;
      }
      if (local_3e0._M_index != '\0') {
        uVar9 = 0xffffff;
      }
      std::__detail::__variant::
      _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
      ::~_Variant_storage(&local_3e0);
      EvalContext::~EvalContext(&local_388);
      if ((oVar16.super__Optional_base<unsigned_int,_true,_true>._M_payload.
           super__Optional_payload_base<unsigned_int>._M_payload <= uVar9) &&
         (local_3b8._M_payload._M_value <= uVar8)) {
        return;
      }
    }
  }
  else {
    bVar3 = Type::isHandleType(clt);
    if ((bVar3) && (bVar3 = Type::isHandleType(crt), bVar3)) {
      return;
    }
    bVar3 = Type::isNumeric(clt);
    if ((bVar3) && (bVar3 = Type::isNumeric(crt), bVar3)) {
      local_388.astCtx.assertionInstance = context->assertionInstance;
      local_388.stack.super_SmallVectorBase<slang::ast::EvalContext::Frame>.data_ =
           (pointer)local_388.stack.super_SmallVectorBase<slang::ast::EvalContext::Frame>.
                    firstElement;
      local_388.astCtx.scope.ptr = (context->scope).ptr;
      local_388.astCtx.lookupIndex = context->lookupIndex;
      local_388.astCtx._12_4_ = *(undefined4 *)&context->field_0xc;
      local_388.astCtx.flags.m_bits = (context->flags).m_bits;
      local_388.astCtx.instanceOrProc = context->instanceOrProc;
      local_388.astCtx.firstTempVar = context->firstTempVar;
      local_388.astCtx.randomizeDetails = context->randomizeDetails;
      local_388.flags.m_bits = '\0';
      local_388._60_8_ = 0;
      local_388._68_8_ = 0;
      local_388.queueTarget._4_4_ = 0;
      local_388.stack.super_SmallVectorBase<slang::ast::EvalContext::Frame>.len = 0;
      local_388.stack.super_SmallVectorBase<slang::ast::EvalContext::Frame>.cap = 2;
      local_388.lvalStack.super_SmallVectorBase<slang::ast::LValue_*>.data_ =
           (pointer)local_388.lvalStack.super_SmallVectorBase<slang::ast::LValue_*>.firstElement;
      local_388.lvalStack.super_SmallVectorBase<slang::ast::LValue_*>.len = 0;
      local_388.lvalStack.super_SmallVectorBase<slang::ast::LValue_*>.cap = 5;
      local_388.diags.super_SmallVector<slang::Diagnostic,_2UL>.
      super_SmallVectorBase<slang::Diagnostic>.data_ =
           (pointer)local_388.diags.super_SmallVector<slang::Diagnostic,_2UL>.
                    super_SmallVectorBase<slang::Diagnostic>.firstElement;
      local_388.diags.super_SmallVector<slang::Diagnostic,_2UL>.
      super_SmallVectorBase<slang::Diagnostic>.len = 0;
      local_388.diags.super_SmallVector<slang::Diagnostic,_2UL>.
      super_SmallVectorBase<slang::Diagnostic>.cap = 2;
      local_388.warnings.super_SmallVector<slang::Diagnostic,_2UL>.
      super_SmallVectorBase<slang::Diagnostic>.data_ =
           (pointer)local_388.warnings.super_SmallVector<slang::Diagnostic,_2UL>.
                    super_SmallVectorBase<slang::Diagnostic>.firstElement;
      local_388.warnings.super_SmallVector<slang::Diagnostic,_2UL>.
      super_SmallVectorBase<slang::Diagnostic>.len = 0;
      local_388.warnings.super_SmallVector<slang::Diagnostic,_2UL>.
      super_SmallVectorBase<slang::Diagnostic>.cap = 2;
      local_388.backtraceReported = false;
      local_388.disableRange.startLoc = (SourceLocation)0x0;
      local_388.disableRange.endLoc = (SourceLocation)0x0;
      Expression::eval((ConstantValue *)&local_3e0,lhs,&local_388);
      Expression::eval((ConstantValue *)&local_3b0,rhs,&local_388);
      if (local_3b0._M_index != '\0' || local_3e0._M_index != '\0') {
        if (clt->canonical == (Type *)0x0) {
          Type::resolveCanonical(clt);
        }
        if (((clt->canonical->super_Symbol).kind == FloatingType) &&
           (bVar3 = Type::isIntegral(crt), bVar3 && local_3b0._M_index != '\0')) {
LAB_00391cd5:
          std::__detail::__variant::
          _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
          ::~_Variant_storage(&local_3b0);
          std::__detail::__variant::
          _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
          ::~_Variant_storage(&local_3e0);
          EvalContext::~EvalContext(&local_388);
          return;
        }
        if (crt->canonical == (Type *)0x0) {
          Type::resolveCanonical(crt);
        }
        if (((crt->canonical->super_Symbol).kind == FloatingType) &&
           (bVar3 = Type::isIntegral(clt), bVar3 && local_3e0._M_index != '\0')) goto LAB_00391cd5;
        if (isComparison) {
          if (local_3e0._M_index == '\x01') {
            pvVar15 = std::
                      get<1ul,std::monostate,slang::SVInt,slang::real_t,slang::shortreal_t,slang::ConstantValue::NullPlaceholder,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>,std::__cxx11::string,slang::CopyPtr<slang::AssociativeArray>,slang::CopyPtr<slang::SVQueue>,slang::CopyPtr<slang::SVUnion>,slang::ConstantValue::UnboundedPlaceholder>
                                ((variant<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                                  *)&local_3e0);
            bStack_3fb = 0;
            local_408.val._0_6_ = 0;
            local_408.val._6_2_ = 0;
            uStack_3fc = 1;
            uStack_400 = 1;
            SVInt::clearUnusedBits((SVInt *)&local_408);
            lVar6 = SVInt::operator==(pvVar15,(SVInt *)&local_408);
            bVar3 = (lVar6.value != '\0' && lVar6.value != 0x80) && lVar6.value != '@';
            if (((0x40 < uStack_400) || ((bStack_3fb & 1) != 0)) &&
               ((void *)CONCAT26(local_408.val._6_2_,local_408.val._0_6_) != (void *)0x0)) {
              operator_delete__((void *)CONCAT26(local_408.val._6_2_,local_408.val._0_6_));
            }
          }
          else {
            bVar3 = false;
          }
          if (bVar3) goto LAB_00391cd5;
          if (local_3b0._M_index == '\x01') {
            pvVar15 = std::
                      get<1ul,std::monostate,slang::SVInt,slang::real_t,slang::shortreal_t,slang::ConstantValue::NullPlaceholder,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>,std::__cxx11::string,slang::CopyPtr<slang::AssociativeArray>,slang::CopyPtr<slang::SVQueue>,slang::CopyPtr<slang::SVUnion>,slang::ConstantValue::UnboundedPlaceholder>
                                ((variant<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                                  *)&local_3b0);
            bStack_40b = 0;
            local_418.val._0_6_ = 0;
            local_418.val._6_2_ = 0;
            uStack_40c = 1;
            uStack_410 = 1;
            SVInt::clearUnusedBits((SVInt *)&local_418);
            lVar6 = SVInt::operator==(pvVar15,(SVInt *)&local_418);
            bVar3 = (lVar6.value != '\0' && lVar6.value != 0x80) && lVar6.value != '@';
            if (((0x40 < uStack_410) || ((bStack_40b & 1) != 0)) &&
               ((void *)CONCAT26(local_418.val._6_2_,local_418.val._0_6_) != (void *)0x0)) {
              operator_delete__((void *)CONCAT26(local_418.val._6_2_,local_418.val._0_6_));
            }
          }
          else {
            bVar3 = false;
          }
          if (bVar3) goto LAB_00391cd5;
        }
      }
      std::__detail::__variant::
      _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
      ::~_Variant_storage(&local_3b0);
      std::__detail::__variant::
      _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
      ::~_Variant_storage(&local_3e0);
      EvalContext::~EvalContext(&local_388);
    }
    else {
      if (clt->canonical == (Type *)0x0) {
        Type::resolveCanonical(clt);
      }
      if (((clt->canonical->super_Symbol).kind == StringType) &&
         (bVar3 = Expression::isImplicitString(rhs), bVar3)) {
        return;
      }
      if (crt->canonical == (Type *)0x0) {
        Type::resolveCanonical(crt);
      }
      if (((crt->canonical->super_Symbol).kind == StringType) &&
         (bVar3 = Expression::isImplicitString(lhs), bVar3)) {
        return;
      }
    }
  }
  pDVar13 = ASTContext::addDiag(context,local_3f4,opRange);
  if (extraDiagArg.
      super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>.
      _M_payload.
      super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
      _M_engaged == true) {
    Diagnostic::operator<<
              (pDVar13,extraDiagArg.
                       super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>
                       ._M_payload.
                       super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>
                       ._M_payload._M_value);
  }
  pDVar14 = ast::operator<<(pDVar13,local_3f0);
  ast::operator<<(pDVar14,local_3e8);
  pDVar13 = Diagnostic::operator<<(pDVar13,lhs->sourceRange);
  Diagnostic::operator<<(pDVar13,rhs->sourceRange);
  return;
}

Assistant:

void BinaryExpression::analyzeOpTypes(const Type& clt, const Type& crt, const Type& originalLt,
                                      const Type& originalRt, const Expression& lhs,
                                      const Expression& rhs, const ASTContext& context,
                                      SourceRange opRange, DiagCode code, bool isComparison,
                                      std::optional<std::string_view> extraDiagArg) {
    // Don't warn if either side is a compiler generated variable
    // (which can be true for genvars).
    auto isCompGenVar = [](const Symbol* sym) {
        if (sym) {
            if (sym->kind == SymbolKind::Variable &&
                sym->as<VariableSymbol>().flags.has(VariableFlags::CompilerGenerated)) {
                return true;
            }

            if (sym->kind == SymbolKind::Parameter && sym->as<ParameterSymbol>().isFromGenvar()) {
                return true;
            }
        }
        return false;
    };

    auto lsym = lhs.getSymbolReference(), rsym = rhs.getSymbolReference();
    if (isCompGenVar(lsym) || isCompGenVar(rsym))
        return;

    // Don't warn if either side is an enum value symbol and the
    // other side is the base type of that enum.
    auto isEnumBaseCompare = [](const Symbol* sym, const Type& otherType) {
        if (sym && sym->kind == SymbolKind::EnumValue) {
            auto& ct = sym->as<EnumValueSymbol>().getType().getCanonicalType();
            if (ct.kind == SymbolKind::EnumType)
                return ct.as<EnumType>().baseType.isMatching(otherType);
        }
        return false;
    };

    if (isComparison && (isEnumBaseCompare(lsym, crt) || isEnumBaseCompare(rsym, clt)))
        return;

    if (clt.isSimpleBitVector() && crt.isSimpleBitVector()) {
        const bool sameSign = clt.isSigned() == crt.isSigned() ||
                              signMatches(lhs.getEffectiveSign(/* isForConversion */ false),
                                          rhs.getEffectiveSign(/* isForConversion */ false));

        if (isComparison) {
            // Comparisons of bit vectors should warn if the signs differ and
            // otherwise should not warn, otherwise you can get quite misleading
            // results like:
            //      logic [7:0] a, b;
            //      bit b = a + b < 257;
            // We don't want a warning for the comparison between logic[7:0] and
            // int because the addition will actually be promoted correctly and
            // everything will work as expected.
            if (sameSign)
                return;

            if ((clt.getBitWidth() == 8 && clt.isPredefinedInteger() && rhs.isImplicitString()) ||
                (crt.getBitWidth() == 8 && crt.isPredefinedInteger() && lhs.isImplicitString())) {
                // Don't warn if the comparison is between `byte` and a string literal.
                return;
            }

            auto& diag = context.addDiag(diag::SignCompare, opRange);
            SLANG_ASSERT(!extraDiagArg);
            diag << originalLt << originalRt;
            diag << lhs.sourceRange << rhs.sourceRange;
            return;
        }

        if (sameSign) {
            // If we have two integers of the same effective sign and size
            // (using the same ideas as in checkImplicitConversions) then we
            // should not warn.
            auto alw = clt.getBitWidth();
            auto arw = crt.getBitWidth();
            if (alw == arw)
                return;

            auto elw = lhs.getEffectiveWidth();
            auto erw = rhs.getEffectiveWidth();
            if (!elw || !erw)
                return;

            if (elw <= arw && alw >= erw)
                return;

            // If either side is a constant we'll assume the max allowed
            // width is actually unbounded.
            EvalContext evalCtx(context);
            if (lhs.eval(evalCtx))
                alw = SVInt::MAX_BITS;
            if (rhs.eval(evalCtx))
                arw = SVInt::MAX_BITS;

            if (elw <= arw && alw >= erw)
                return;
        }
    }
    else if (clt.isHandleType() && crt.isHandleType()) {
        // Ignore operations between handles (like comparing a class handle with null).
        return;
    }
    else if (clt.isNumeric() && crt.isNumeric()) {
        // If either side is a constant we might want to avoid warning.
        // The cases that I think make sense are:
        // - comparing any numeric value against the constant 0
        // - any floating value operator alongside an integer constant
        EvalContext evalCtx(context);
        auto lcv = lhs.eval(evalCtx);
        auto rcv = rhs.eval(evalCtx);
        if (lcv || rcv) {
            if (clt.isFloating() && crt.isIntegral() && rcv)
                return;
            if (crt.isFloating() && clt.isIntegral() && lcv)
                return;

            if (isComparison) {
                if (lcv.isInteger() && bool(lcv.integer() == 0))
                    return;
                if (rcv.isInteger() && bool(rcv.integer() == 0))
                    return;
            }
        }
    }
    else if ((clt.isString() && rhs.isImplicitString()) ||
             (crt.isString() && lhs.isImplicitString())) {
        // Ignore operations between strings and string literals.
        return;
    }

    auto& diag = context.addDiag(code, opRange);
    if (extraDiagArg)
        diag << *extraDiagArg;
    diag << originalLt << originalRt;
    diag << lhs.sourceRange << rhs.sourceRange;
}